

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O0

void __thiscall
wasm::InsertOrderedMap<wasm::Type,_unsigned_int>::InsertOrderedMap
          (InsertOrderedMap<wasm::Type,_unsigned_int> *this,
          InsertOrderedMap<wasm::Type,_unsigned_int> *other)

{
  bool bVar1;
  reference ppVar2;
  undefined1 auStack_58 [8];
  pair<const_wasm::Type,_unsigned_int> kv;
  _Self local_40;
  const_iterator __end0;
  _Self local_28;
  const_iterator __begin0;
  InsertOrderedMap<wasm::Type,_unsigned_int> *__range2;
  InsertOrderedMap<wasm::Type,_unsigned_int> *other_local;
  InsertOrderedMap<wasm::Type,_unsigned_int> *this_local;
  
  std::
  unordered_map<wasm::Type,_std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>_>_>_>
  ::unordered_map(&this->Map);
  std::__cxx11::
  list<std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
  ::list(&this->List);
  __begin0._M_node = (_List_node_base *)other;
  local_28._M_node = (_List_node_base *)begin(other);
  local_40._M_node = (_List_node_base *)end(__begin0._M_node);
  while( true ) {
    bVar1 = std::operator!=(&local_28,&local_40);
    if (!bVar1) break;
    ppVar2 = std::_List_const_iterator<std::pair<const_wasm::Type,_unsigned_int>_>::operator*
                       (&local_28);
    auStack_58 = (undefined1  [8])(ppVar2->first).id;
    kv.first.id = *(uintptr_t *)&ppVar2->second;
    insert(this,(pair<const_wasm::Type,_unsigned_int> *)auStack_58);
    std::_List_const_iterator<std::pair<const_wasm::Type,_unsigned_int>_>::operator++(&local_28);
  }
  return;
}

Assistant:

InsertOrderedMap(const InsertOrderedMap& other) {
    for (auto kv : other) {
      insert(kv);
    }
  }